

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter_impl.h
# Opt level: O0

void __thiscall spdlog::details::q_formatter::format(q_formatter *this,log_msg *msg,tm *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  BasicStringRef<char> local_30;
  tm *local_20;
  tm *param_2_local;
  log_msg *msg_local;
  q_formatter *this_local;
  
  local_20 = param_2;
  param_2_local = (tm *)msg;
  msg_local = (log_msg *)this;
  os::thread_name_abi_cxx11_();
  fmt::BasicStringRef<char>::BasicStringRef<std::allocator<char>>(&local_30,&local_50);
  fmt::BasicWriter<char>::operator<<(&(msg->formatted).super_BasicWriter<char>,local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void format(details::log_msg &msg, const std::tm &) override
    {	
        msg.formatted << os::thread_name();
    }